

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O2

void __thiscall FIX::ScreenLog::~ScreenLog(ScreenLog *this)

{
  (this->super_Log)._vptr_Log = (_func_int **)&PTR__ScreenLog_001ef508;
  std::__cxx11::string::~string((string *)&this->m_prefix);
  return;
}

Assistant:

ScreenLog( bool incoming, bool outgoing, bool event )
: m_prefix( "GLOBAL" ),
  m_incoming( incoming ), m_outgoing( outgoing ), m_event( event ) {}